

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall ByteVec::ByteVec(ByteVec *this,void *key,int len)

{
  reference __dest;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b3091);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(in_RDI);
  memcpy(__dest,in_RSI,(long)in_EDX);
  return;
}

Assistant:

ByteVec ( const void * key, int len )
  {
    resize(len);
    memcpy(&front(),key,len);
  }